

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestEnd(StreamingListener *this,TestInfo *test_info)

{
  bool bVar1;
  TestResult *pTVar2;
  undefined8 uVar3;
  TimeInMillis local_60;
  string local_58;
  string local_38;
  TestInfo *local_18;
  TestInfo *test_info_local;
  StreamingListener *this_local;
  
  local_18 = test_info;
  test_info_local = (TestInfo *)this;
  pTVar2 = TestInfo::result(test_info);
  bVar1 = TestResult::Passed(pTVar2);
  pTVar2 = TestInfo::result(local_18);
  local_60 = TestResult::elapsed_time(pTVar2);
  StreamableToString<long_long>(&local_58,&local_60);
  uVar3 = std::__cxx11::string::c_str();
  String::Format_abi_cxx11_
            (&local_38,"event=TestEnd&passed=%d&elapsed_time=%sms\n",(ulong)bVar1,uVar3);
  Send(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void OnTestEnd(const TestInfo& test_info) {
    Send(String::Format(
        "event=TestEnd&passed=%d&elapsed_time=%sms\n",
        (test_info.result())->Passed(),
        StreamableToString((test_info.result())->elapsed_time()).c_str()));
  }